

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::rehash
          (Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *this,size_t sizeHint)

{
  Entry *pEVar1;
  ulong uVar2;
  Span *pSVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  undefined8 uVar7;
  Chain *pCVar8;
  Node *pNVar9;
  ulong uVar10;
  Span *pSVar11;
  size_t index;
  long lVar12;
  size_t sVar13;
  QtFontFallbacksCacheKey *t;
  long lVar14;
  R RVar15;
  Bucket BVar16;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar13 = 0x80;
  if ((0x40 < sizeHint) && (sVar13 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar12 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    sVar13 = 1L << (0x41 - ((byte)lVar12 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar15 = allocateSpans(sVar13);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = sVar13;
  if (0x7f < uVar2) {
    uVar10 = 0;
    pSVar11 = pSVar3;
    do {
      lVar12 = 0;
      do {
        if ((ulong)pSVar11->offsets[lVar12] != 0xff) {
          pEVar1 = pSVar3[uVar10].entries + pSVar11->offsets[lVar12];
          t = (QtFontFallbacksCacheKey *)((pEVar1->storage).data + 0x10);
          sVar13 = calculateHash<QtFontFallbacksCacheKey>(t,this->seed);
          BVar16 = findBucketWithHash<QtFontFallbacksCacheKey>(this,t,sVar13);
          pNVar9 = Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::insert
                             (BVar16.span,BVar16.index);
          pCVar8 = *(Chain **)((pEVar1->storage).data + 8);
          (pNVar9->super_Chain).prev = *(Chain **)(pEVar1->storage).data;
          (pNVar9->super_Chain).next = pCVar8;
          pDVar4 = (t->family).d.d;
          (t->family).d.d = (Data *)0x0;
          (pNVar9->key).family.d.d = pDVar4;
          pcVar5 = *(char16_t **)((pEVar1->storage).data + 0x18);
          (pEVar1->storage).data[0x18] = '\0';
          (pEVar1->storage).data[0x19] = '\0';
          (pEVar1->storage).data[0x1a] = '\0';
          (pEVar1->storage).data[0x1b] = '\0';
          (pEVar1->storage).data[0x1c] = '\0';
          (pEVar1->storage).data[0x1d] = '\0';
          (pEVar1->storage).data[0x1e] = '\0';
          (pEVar1->storage).data[0x1f] = '\0';
          (pNVar9->key).family.d.ptr = pcVar5;
          qVar6 = *(qsizetype *)((pEVar1->storage).data + 0x20);
          (pEVar1->storage).data[0x20] = '\0';
          (pEVar1->storage).data[0x21] = '\0';
          (pEVar1->storage).data[0x22] = '\0';
          (pEVar1->storage).data[0x23] = '\0';
          (pEVar1->storage).data[0x24] = '\0';
          (pEVar1->storage).data[0x25] = '\0';
          (pEVar1->storage).data[0x26] = '\0';
          (pEVar1->storage).data[0x27] = '\0';
          (pNVar9->key).family.d.size = qVar6;
          uVar7 = *(undefined8 *)((pEVar1->storage).data + 0x28);
          (pNVar9->key).style = (int)uVar7;
          (pNVar9->key).styleHint = (int)((ulong)uVar7 >> 0x20);
          (pNVar9->key).script = *(int *)((pEVar1->storage).data + 0x30);
          (pNVar9->value).t = *(QList<QString> **)((pEVar1->storage).data + 0x38);
          (pNVar9->value).cost = *(qsizetype *)((pEVar1->storage).data + 0x40);
          (pEVar1->storage).data[0x38] = '\0';
          (pEVar1->storage).data[0x39] = '\0';
          (pEVar1->storage).data[0x3a] = '\0';
          (pEVar1->storage).data[0x3b] = '\0';
          (pEVar1->storage).data[0x3c] = '\0';
          (pEVar1->storage).data[0x3d] = '\0';
          (pEVar1->storage).data[0x3e] = '\0';
          (pEVar1->storage).data[0x3f] = '\0';
          ((pNVar9->super_Chain).prev)->next = &pNVar9->super_Chain;
          ((pNVar9->super_Chain).next)->prev = &pNVar9->super_Chain;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x80);
      Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::freeData(pSVar3 + uVar10);
      uVar10 = uVar10 + 1;
      pSVar11 = pSVar11 + 1;
    } while (uVar10 != uVar2 >> 7);
  }
  if (pSVar3 != (Span *)0x0) {
    lVar12 = *(long *)&pSVar3[-1].allocated;
    if (lVar12 != 0) {
      lVar14 = lVar12 * 0x90;
      do {
        Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::freeData
                  ((Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *)
                   (pSVar3[-1].offsets + lVar14));
        lVar14 = lVar14 + -0x90;
      } while (lVar14 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar12 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }